

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::ProfiledNewScIntArray
              (AuxArray<int> *ints,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  uint uVar2;
  ThreadContext *pTVar3;
  JavascriptLibrary *lib;
  FunctionBody *functionBody;
  code *pcVar4;
  bool bVar5;
  JavascriptNativeArray *this;
  undefined4 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong srcCount;
  SparseArraySegmentBase *pSVar9;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  uVar2 = ints->count;
  srcCount = (ulong)uVar2;
  if ((((arrayInfo->field_0).bits & 1) != 0) ||
     (bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar5)) {
    if ((((arrayInfo->field_0).bits & 2) != 0) ||
       (bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar5)) {
      this = (JavascriptNativeArray *)
             JavascriptLibrary::CreateArrayLiteral
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar2);
      pSVar9 = (this->super_JavascriptArray).head.ptr;
      if ((srcCount == 0) || (uVar2 != pSVar9->length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x40f,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar5) {
LAB_00b7ba05:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      if (srcCount != 0) {
        pSVar9 = pSVar9 + 1;
        uVar7 = 0;
        do {
          uVar2 = ints[uVar7 + 1].count;
          Memory::Recycler::WBSetBit((char *)pSVar9);
          uVar8 = (ulong)uVar2 | 0x1000000000000;
          pSVar9->left = (int)uVar8;
          pSVar9->length = (int)(uVar8 >> 0x20);
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar9);
          uVar7 = uVar7 + 1;
          pSVar9 = (SparseArraySegmentBase *)&pSVar9->size;
        } while (srcCount != uVar7);
      }
    }
    else {
      this = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar2)->
              super_JavascriptNativeArray;
      pSVar9 = (this->super_JavascriptArray).head.ptr;
      if ((srcCount == 0) || (uVar2 != pSVar9->length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x403,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar5) goto LAB_00b7ba05;
        *puVar6 = 0;
      }
      if (srcCount != 0) {
        uVar7 = 0;
        do {
          *(double *)(&pSVar9[1].left + uVar7 * 2) = (double)(int)ints[uVar7 + 1].count;
          uVar7 = uVar7 + 1;
        } while (srcCount != uVar7);
      }
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
    }
  }
  else {
    lib = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    functionBody = (FunctionBody *)(weakFuncRef->super_RecyclerWeakReferenceBase).strongRef;
    bVar5 = JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib,arrayInfo,uVar2);
    if (bVar5) {
      if ((lib->cacheForCopyOnAccessArraySegments).ptr == (CacheForCopyOnAccessArraySegments *)0x0)
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x3ee,"(lib->cacheForCopyOnAccessArraySegments)",
                                    "lib->cacheForCopyOnAccessArraySegments");
        if (!bVar5) goto LAB_00b7ba05;
        *puVar6 = 0;
      }
      this = &JavascriptLibrary::CreateCopyOnAccessNativeIntArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,arrayInfo,
                         functionBody,ints)->super_JavascriptNativeArray;
    }
    else {
      this = &JavascriptLibrary::CreateNativeIntArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar2)->
              super_JavascriptNativeArray;
      pSVar9 = (((JavascriptNativeArray *)&this->super_JavascriptArray)->super_JavascriptArray).head
               .ptr;
      if ((srcCount == 0) || (uVar2 != pSVar9->length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x3f6,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar5) goto LAB_00b7ba05;
        *puVar6 = 0;
      }
      Memory::CopyArray<int,int,Memory::Recycler>
                ((int *)(pSVar9 + 1),(ulong)pSVar9->length,(int *)(ints + 1),srcCount);
    }
    JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
  }
  pTVar3->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptArray::ProfiledNewScIntArray(AuxArray<int32> *ints, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScIntArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        uint32 count = ints->count;

        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr;

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary *lib = scriptContext->GetLibrary();
            FunctionBody *functionBody = weakFuncRef->Get();

            if (JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib, arrayInfo, count))
            {
                Assert(lib->cacheForCopyOnAccessArraySegments);
                arr = scriptContext->GetLibrary()->CreateCopyOnAccessNativeIntArrayLiteral(arrayInfo, functionBody, ints);
            }
            else
#endif
            {
                arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(count);
                SparseArraySegment<int32> *head = SparseArraySegment<int32>::From(arr->head);
                Assert(count > 0 && count == head->length);
                CopyArray(head->elements, head->length, ints->elements, count);
            }

            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            for (uint i = 0; i < count; i++)
            {
                head->elements[i] = (double)ints->elements[i];
            }
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            head->elements[i] = JavascriptNumber::ToVar(ints->elements[i], scriptContext);
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScIntArray);
    }